

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void fillMath(ElementType a,ElementType b,ElementType c,ElementType d,ElementType e,ElementType f,
             Storage3D *field,int64_t domain_size,int64_t domain_height)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ElementType y;
  
  lVar3 = -halo_width;
  lVar1 = halo_width + domain_size;
  if (lVar1 != lVar3 && SBORROW8(lVar1,lVar3) == lVar1 + halo_width < 0) {
    dVar9 = 1.0 / (double)(domain_size + halo_width * 2);
    lVar1 = halo_width;
    do {
      lVar4 = -lVar1;
      lVar2 = lVar1 + domain_size;
      if (lVar2 != lVar4 && SBORROW8(lVar2,lVar4) == lVar2 + lVar1 < 0) {
        dVar5 = (double)lVar3 * dVar9;
        do {
          if (0 < domain_height) {
            dVar6 = (double)lVar4 * dVar9;
            lVar2 = 0;
            do {
              dVar7 = cos(pi * (dVar5 * 1.5 + dVar6));
              dVar8 = sin(pi * c * (dVar6 + dVar5 + dVar5));
              field->alignedPtr
              [field->offset +
               (field->strides)._M_elems[2] * lVar4 +
               (field->strides)._M_elems[1] * lVar3 + (field->strides)._M_elems[0] * lVar2] =
                   (double)lVar2 * 0.01 + ((dVar8 + dVar7 + b) * a) / d;
              lVar2 = lVar2 + 1;
              lVar1 = halo_width;
            } while (domain_height != lVar2);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < lVar1 + domain_size);
        lVar2 = lVar1 + domain_size;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  return;
}

Assistant:

void fillMath(ElementType a, ElementType b, ElementType c, ElementType d,
              ElementType e, ElementType f, Storage3D &field, const int64_t domain_size, const int64_t domain_height) {
  ElementType dx = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);
  ElementType dy = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);

  for (int64_t j = -halo_width; j < domain_size + halo_width; j++) {
    for (int64_t i = -halo_width; i < domain_size + halo_width; i++) {
      ElementType x = dx * (ElementType) i;
      ElementType y = dy * (ElementType) j;
      for (int64_t k = 0; k < domain_height; k++) {
          field(i, j, k) = k*ElementType(10e-3) + a*(b + cos(pi*(x + c*y)) + sin(d*pi*(x + e*y)))/f;
      }
    }
  }
}